

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
ProfiledGetProperty<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>const__unaligned,false,false,false>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout,Var instance)

{
  PropertyId propertyId;
  InlineCache *inlineCache;
  Var value;
  
  propertyId = GetPropertyIdFromCacheId(this,(uint)playout->inlineCacheIndex);
  inlineCache = GetInlineCache(this,(uint)playout->inlineCacheIndex);
  value = ProfilingHelpers::ProfiledLdFld<false,false,false>
                    (instance,propertyId,inlineCache,(uint)playout->inlineCacheIndex,
                     *(FunctionBody **)(this + 0x88),instance);
  SetReg<unsigned_short>(this,playout->Value,value);
  return;
}

Assistant:

void InterpreterStackFrame::ProfiledGetProperty(unaligned T* playout, const Var instance)
    {
        PropertyId propertyId = GetPropertyIdFromCacheId(playout->inlineCacheIndex);
        Var value = ProfilingHelpers::ProfiledLdFld<Root, Method, CallApplyTarget>(
            instance,
            propertyId,
            GetInlineCache(playout->inlineCacheIndex),
            playout->inlineCacheIndex,
            GetFunctionBody(),
            instance);

        SetReg(playout->Value, value);

#ifdef TELEMETRY_INTERPRETER
        if (TELEMETRY_PROPERTY_OPCODE_FILTER(propertyId))
        {
            // `successful` will be true as PatchGetRootValue throws an exception if not found.
            this->scriptContext->GetTelemetry().GetOpcodeTelemetry().GetProperty(instance, propertyId, value, /*successful:*/true);
        }
#endif
    }